

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O1

REF_STATUS ref_cloud_deep_copy(REF_CLOUD *ref_cloud_ptr,REF_CLOUD original)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  REF_DBL *pRVar4;
  REF_CLOUD pRVar5;
  REF_GLOB *pRVar6;
  REF_DBL *pRVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  REF_GLOB RVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  
  pRVar5 = (REF_CLOUD)malloc(0x20);
  *ref_cloud_ptr = pRVar5;
  if (pRVar5 == (REF_CLOUD)0x0) {
    pcVar12 = "malloc *ref_cloud_ptr of REF_CLOUD_STRUCT NULL";
    uVar8 = 0x3b;
  }
  else {
    uVar1 = original->n;
    pRVar5->n = uVar1;
    iVar2 = original->max;
    pRVar5->max = iVar2;
    uVar3 = original->naux;
    uVar14 = (ulong)uVar3;
    pRVar5->naux = uVar3;
    if ((long)iVar2 < 0) {
      pcVar12 = "malloc ref_cloud->global of REF_GLOB negative";
      uVar8 = 0x43;
LAB_002175b2:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",uVar8
             ,"ref_cloud_deep_copy",pcVar12);
      return 1;
    }
    pRVar6 = (REF_GLOB *)malloc((long)iVar2 * 8);
    pRVar5->global = pRVar6;
    if (pRVar6 == (REF_GLOB *)0x0) {
      pcVar12 = "malloc ref_cloud->global of REF_GLOB NULL";
      uVar8 = 0x43;
    }
    else {
      if ((int)(iVar2 * uVar3) < 0) {
        pcVar12 = "malloc ref_cloud->aux of REF_DBL negative";
        uVar8 = 0x45;
        goto LAB_002175b2;
      }
      pRVar7 = (REF_DBL *)malloc((ulong)(iVar2 * uVar3) << 3);
      pRVar5->aux = pRVar7;
      if (pRVar7 != (REF_DBL *)0x0) {
        if (0 < (int)uVar1) {
          RVar11 = *original->global;
          lVar9 = 0;
          uVar10 = 0;
          do {
            pRVar6[uVar10] = RVar11;
            if (0 < (int)uVar3) {
              pRVar4 = original->aux;
              uVar13 = 0;
              do {
                pRVar7[uVar13] = *(REF_DBL *)((long)pRVar4 + uVar13 * 8 + lVar9);
                uVar13 = uVar13 + 1;
              } while (uVar14 != uVar13);
            }
            uVar10 = uVar10 + 1;
            RVar11 = -1;
            if (uVar10 < uVar1) {
              RVar11 = original->global[uVar10];
            }
            pRVar7 = pRVar7 + uVar14;
            lVar9 = lVar9 + uVar14 * 8;
          } while (uVar10 != uVar1);
        }
        return 0;
      }
      pcVar12 = "malloc ref_cloud->aux of REF_DBL NULL";
      uVar8 = 0x45;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",uVar8,
         "ref_cloud_deep_copy",pcVar12);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_deep_copy(REF_CLOUD *ref_cloud_ptr,
                                       REF_CLOUD original) {
  REF_CLOUD ref_cloud;
  REF_INT item, i;
  REF_GLOB global;

  ref_malloc(*ref_cloud_ptr, 1, REF_CLOUD_STRUCT);

  ref_cloud = (*ref_cloud_ptr);

  ref_cloud_n(ref_cloud) = ref_cloud_n(original);
  ref_cloud_max(ref_cloud) = ref_cloud_max(original);
  ref_cloud_naux(ref_cloud) = ref_cloud_naux(original);

  ref_malloc(ref_cloud->global, ref_cloud_max(ref_cloud), REF_GLOB);
  ref_malloc(ref_cloud->aux,
             ref_cloud_naux(ref_cloud) * ref_cloud_max(ref_cloud), REF_DBL);

  each_ref_cloud_global(original, item, global) {
    ref_cloud_global(ref_cloud, item) = global;
    each_ref_cloud_aux(ref_cloud, i) {
      ref_cloud_aux(ref_cloud, i, item) = ref_cloud_aux(original, i, item);
    }
  }

  return REF_SUCCESS;
}